

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *src1Val,Value *src2Val,
          bool isNotTypeSpecConv,bool forceInvariantHoisting)

{
  OpCode OVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  Func *pFVar5;
  undefined4 *puVar6;
  PropertySymOpnd *this_00;
  PropertySym *this_01;
  StackSym *sym;
  GlobOptBlockData *this_02;
  Value *srcVal;
  Opnd *pOVar7;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  StackSym *objectTypeSym;
  PropertySym *propertySym;
  bool allowNonPrimitives;
  bool forceInvariantHoisting_local;
  bool isNotTypeSpecConv_local;
  Value *src2Val_local;
  Value *src1Val_local;
  Loop *loop_local;
  BasicBlock *block_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar4 = Loop::CanHoistInvariants(loop);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::CanCSE(instr->m_opcode);
  if (!bVar4) {
    return false;
  }
  bVar4 = OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);
  propertySym._5_1_ = !bVar4;
  OVar1 = instr->m_opcode;
  if (OVar1 != Ld_A) {
    if (OVar1 == LdLen_A) {
      return false;
    }
    if (OVar1 == LdArgumentsFromFrame) {
      pFVar2 = instr->m_func;
      pFVar5 = Loop::GetFunc(loop);
      if (pFVar2 != pFVar5) {
        return false;
      }
      goto LAB_005af6da;
    }
    if (OVar1 == FromVar) {
      bVar4 = IR::Instr::HasBailOutInfo(instr);
      propertySym._5_1_ = bVar4 || propertySym._5_1_;
      goto LAB_005af6da;
    }
    if (1 < (ushort)(OVar1 - Ld_I4)) {
      if (OVar1 == BailOnNotStackArgs) {
        return false;
      }
      if (OVar1 == CheckObjType) {
        pOVar7 = IR::Instr::GetSrc1(instr);
        if (pOVar7 == (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3a4c,"(instr->GetSrc1())","instr->GetSrc1()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pOVar7 = IR::Instr::GetSrc1(instr);
        this_00 = IR::Opnd::AsPropertySymOpnd(pOVar7);
        this_01 = IR::PropertySymOpnd::GetPropertySym(this_00);
        bVar4 = PropertySym::HasObjectTypeSym(this_01);
        if (bVar4) {
          sym = PropertySym::GetObjectTypeSym(this_01);
          this_02 = CurrentBlockData(this);
          srcVal = GlobOptBlockData::FindValue(this_02,&sym->super_Sym);
          bVar4 = OptIsInvariant(this,&sym->super_Sym,block,loop,srcVal,true,true,(Value **)0x0);
          if (!bVar4) {
            return false;
          }
        }
      }
      goto LAB_005af6da;
    }
  }
  if (!forceInvariantHoisting) {
    return false;
  }
LAB_005af6da:
  pOVar7 = IR::Instr::GetDst(instr);
  if ((pOVar7 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsRegOpnd(pOVar7), !bVar4)) {
    return false;
  }
  pOVar7 = IR::Instr::GetSrc1(instr);
  if (pOVar7 != (Opnd *)0x0) {
    bVar4 = OptIsInvariant(this,pOVar7,block,loop,src1Val,isNotTypeSpecConv,propertySym._5_1_);
    if (!bVar4) {
      return false;
    }
    pOVar7 = IR::Instr::GetSrc2(instr);
    if ((pOVar7 != (Opnd *)0x0) &&
       (bVar4 = OptIsInvariant(this,pOVar7,block,loop,src2Val,isNotTypeSpecConv,propertySym._5_1_),
       !bVar4)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
GlobOpt::OptIsInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *src1Val,
    Value *src2Val,
    bool isNotTypeSpecConv,
    const bool forceInvariantHoisting)
{
    if (!loop->CanHoistInvariants())
    {
        return false;
    }
    if (!OpCodeAttr::CanCSE(instr->m_opcode))
    {
        return false;
    }

    bool allowNonPrimitives = !OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);

    switch(instr->m_opcode)
    {
        // Can't legally hoist these
    case Js::OpCode::LdLen_A:
        return false;

        //Can't Hoist BailOnNotStackArgs, as it is necessary as InlineArgsOptimization relies on this opcode
        //to decide whether to throw rejit exception or not.
    case Js::OpCode::BailOnNotStackArgs:
        return false;

        // Usually not worth hoisting these
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdC_A_I4:
        if(!forceInvariantHoisting)
        {
            return false;
        }
        break;

        // Can't hoist these outside the function it's for. The LdArgumentsFromFrame for an inlinee depends on the inlinee meta arg
        // that holds the arguments object, which is only initialized at the start of the inlinee. So, can't hoist this outside the
        // inlinee.
    case Js::OpCode::LdArgumentsFromFrame:
        if(instr->m_func != loop->GetFunc())
        {
            return false;
        }
        break;

    case Js::OpCode::FromVar:
        if (instr->HasBailOutInfo())
        {
            allowNonPrimitives = true;
        }
        break;
    case Js::OpCode::CheckObjType:
        // Bug 11712101: If the operand is a field, ensure that its containing object type is invariant
        // before hoisting -- that is, don't hoist a CheckObjType over a DeleteFld on that object.
        // (CheckObjType only checks the operand and its immediate parent, so we don't need to go
        // any farther up the object graph.)
        Assert(instr->GetSrc1());
        PropertySym *propertySym = instr->GetSrc1()->AsPropertySymOpnd()->GetPropertySym();
        if (propertySym->HasObjectTypeSym()) {
            StackSym *objectTypeSym = propertySym->GetObjectTypeSym();
            if (!this->OptIsInvariant(objectTypeSym, block, loop, this->CurrentBlockData()->FindValue(objectTypeSym), true, true)) {
                return false;
            }
        }

        break;
    }

    IR::Opnd *dst = instr->GetDst();

    if (dst && !dst->IsRegOpnd())
    {
        return false;
    }

    IR::Opnd *src1 = instr->GetSrc1();

    if (src1)
    {
        if (!this->OptIsInvariant(src1, block, loop, src1Val, isNotTypeSpecConv, allowNonPrimitives))
        {
            return false;
        }

        IR::Opnd *src2 = instr->GetSrc2();

        if (src2)
        {
            if (!this->OptIsInvariant(src2, block, loop, src2Val, isNotTypeSpecConv, allowNonPrimitives))
            {
                return false;
            }
        }
    }

    return true;
}